

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZoneFormat::format
          (TimeZoneFormat *this,Formattable *obj,UnicodeString *appendTo,FieldPosition *pos,
          UErrorCode *status)

{
  Type TVar1;
  UObject *pUVar2;
  TimeZone *pTVar3;
  Calendar *this_00;
  double dVar4;
  int32_t rawOffset;
  int32_t dstOffset;
  UnicodeString result;
  UChar buf [128];
  int local_18c;
  UDate local_188;
  int local_17c;
  UnicodeString local_178;
  UChar local_138 [132];
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_188 = Calendar::getNow();
    TVar1 = Formattable::getType(obj);
    if ((TVar1 == kObject) && (pUVar2 = Formattable::getObject(obj), pUVar2 != (UObject *)0x0)) {
      pTVar3 = (TimeZone *)__dynamic_cast(pUVar2,&UObject::typeinfo,&TimeZone::typeinfo,0);
      dVar4 = local_188;
      if (pTVar3 == (TimeZone *)0x0) {
        this_00 = (Calendar *)__dynamic_cast(pUVar2,&UObject::typeinfo,&Calendar::typeinfo,0);
        if (this_00 == (Calendar *)0x0) {
          return appendTo;
        }
        pTVar3 = Calendar::getTimeZone(this_00);
        dVar4 = Calendar::getTimeInMillis(this_00,status);
      }
      (*(pTVar3->super_UObject)._vptr_UObject[6])(dVar4,pTVar3,0,&local_18c,&local_17c,status);
      UnicodeString::UnicodeString(&local_178,local_138,0,0x80);
      formatOffsetLocalizedGMT(this,local_17c + local_18c,&local_178,status);
      if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
         (UnicodeString::append(appendTo,&local_178), pos->fField == 0x11)) {
        pos->fBeginIndex = 0;
        if (-1 < local_178.fUnion.fStackFields.fLengthAndFlags) {
          local_178.fUnion.fFields.fLength = (int)local_178.fUnion.fStackFields.fLengthAndFlags >> 5
          ;
        }
        pos->fEndIndex = local_178.fUnion.fFields.fLength;
      }
      UnicodeString::~UnicodeString(&local_178);
    }
  }
  return appendTo;
}

Assistant:

UnicodeString&
TimeZoneFormat::format(const Formattable& obj, UnicodeString& appendTo,
        FieldPosition& pos, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return appendTo;
    }
    UDate date = Calendar::getNow();
    if (obj.getType() == Formattable::kObject) {
        const UObject* formatObj = obj.getObject();
        const TimeZone* tz = dynamic_cast<const TimeZone*>(formatObj);
        if (tz == NULL) {
            const Calendar* cal = dynamic_cast<const Calendar*>(formatObj);
            if (cal != NULL) {
                tz = &cal->getTimeZone();
                date = cal->getTime(status);
            }
        }
        if (tz != NULL) {
            int32_t rawOffset, dstOffset;
            tz->getOffset(date, FALSE, rawOffset, dstOffset, status);
            UChar buf[ZONE_NAME_U16_MAX];
            UnicodeString result(buf, 0, UPRV_LENGTHOF(buf));
            formatOffsetLocalizedGMT(rawOffset + dstOffset, result, status);
            if (U_SUCCESS(status)) {
                appendTo.append(result);
                if (pos.getField() == UDAT_TIMEZONE_FIELD) {
                    pos.setBeginIndex(0);
                    pos.setEndIndex(result.length());
                }
            }
        }
    }
    return appendTo;
}